

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastcgi_api.cpp
# Opt level: O3

void __thiscall cppcms::impl::cgi::fastcgi::on_start_request(fastcgi *this,error_code *e,handler *h)

{
  uchar uVar1;
  ushort uVar2;
  uint uVar3;
  pointer pcVar4;
  pointer pcVar5;
  ushort *puVar6;
  ushort *puVar7;
  uint *puVar8;
  bool bVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  locale l;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pairs;
  string name;
  ostringstream ss;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> local_258;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> local_250;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> local_248;
  locale local_240 [8];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_238;
  string local_220;
  string local_200;
  element_type *local_1d8;
  locale local_1d0 [8];
  undefined1 local_1c8 [24];
  element_type *local_1b0;
  page *local_1a8;
  error_category *local_1a0;
  ios_base local_138 [264];
  
  if (e->_M_value != 0) {
    booster::callback<void_(const_std::error_code_&)>::operator()(h,e);
    return;
  }
  if ((this->header_).version == '\x01') {
    uVar1 = (this->header_).type;
    if (uVar1 != '\x01') {
      if (uVar1 != '\t') {
        (*(this->super_connection)._vptr_connection[0xf])(this,h);
        return;
      }
      (this->header_).type = '\n';
      local_238.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_238.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::reserve(&local_238,4);
      bVar9 = parse_pairs(this,&local_238);
      if (!bVar9) {
        local_1a8 = (page *)CONCAT44(local_1a8._4_4_,1);
        local_1a0 = (error_category *)&cppcms_category;
        booster::callback<void_(const_std::error_code_&)>::operator()(h,(error_code *)&local_1a8);
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&local_238);
        return;
      }
      pcVar4 = (this->body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish != pcVar4) {
        (this->body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = pcVar4;
      }
      std::locale::locale(local_240,"C");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::ios::imbue(local_1d0);
      std::locale::~locale(local_1d0);
      std::ostream::operator<<(&local_1a8,this->cuncurrency_hint_);
      if (local_238.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_238.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar11 = 0;
        uVar12 = 1;
        do {
          pcVar5 = local_238.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar11].first._M_dataplus._M_p;
          local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_200,pcVar5,
                     pcVar5 + local_238.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar11].first.
                              _M_string_length);
          iVar10 = std::__cxx11::string::compare((char *)&local_200);
          if ((iVar10 == 0) ||
             (iVar10 = std::__cxx11::string::compare((char *)&local_200), iVar10 == 0)) {
            std::__cxx11::stringbuf::str();
            add_pair(this,&local_200,&local_220);
LAB_00231342:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != &local_220.field_2) {
              operator_delete(local_220._M_dataplus._M_p);
            }
          }
          else {
            iVar10 = std::__cxx11::string::compare((char *)&local_200);
            if (iVar10 == 0) {
              local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"0","");
              add_pair(this,&local_200,&local_220);
              goto LAB_00231342;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            operator_delete(local_200._M_dataplus._M_p);
          }
          bVar9 = uVar12 < (ulong)((long)local_238.
                                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_238.
                                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 6);
          uVar11 = uVar12;
          uVar12 = (ulong)((int)uVar12 + 1);
        } while (bVar9);
      }
      self((fastcgi *)&stack0xfffffffffffffe20);
      mfunc_to_event_handler<cppcms::impl::cgi::fastcgi,std::shared_ptr<cppcms::impl::cgi::fastcgi>,booster::callback<void(std::error_code_const&)>const&,booster::callback<void(std::error_code_const&)>>
                ((offset_in_fastcgi_to_subr)&local_248,
                 (shared_ptr<cppcms::impl::cgi::fastcgi> *)on_params_response_sent,
                 (callback<void_(const_std::error_code_&)> *)0x0);
      local_200._M_dataplus._M_p = (pointer)local_248.p_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248.p_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        booster::atomic_counter::inc();
      }
      async_send_respnse(this,(handler *)&local_200);
      booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
                ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)&local_200);
      booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
                (&local_248);
      if (local_1d8 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      std::locale::~locale(local_240);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_238);
    }
    puVar6 = (ushort *)
             (this->body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar7 = (ushort *)
             (this->body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((long)puVar7 - (long)puVar6 == 8) {
      uVar2 = *puVar6;
      *puVar6 = uVar2 << 8 | uVar2 >> 8;
      this->keep_alive_ = (bool)((byte)puVar6[1] & 1);
      if (uVar2 == 0x100) {
        this->request_id_ = (uint)(this->header_).request_id;
        if (puVar7 != puVar6) {
          (this->body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)puVar6;
        }
        bVar9 = non_blocking_read_record(this);
        if (bVar9) {
          local_1a8 = (page *)((ulong)local_1a8 & 0xffffffff00000000);
          local_1a0 = (error_category *)std::_V2::system_category();
          params_record_expected(this,(error_code *)&local_1a8,h);
          return;
        }
        self((fastcgi *)local_1c8);
        mfunc_to_event_handler<cppcms::impl::cgi::fastcgi,std::shared_ptr<cppcms::impl::cgi::fastcgi>,booster::callback<void(std::error_code_const&)>const&,booster::callback<void(std::error_code_const&)>>
                  ((offset_in_fastcgi_to_subr)&local_258,
                   (shared_ptr<cppcms::impl::cgi::fastcgi> *)params_record_expected,
                   (callback<void_(const_std::error_code_&)> *)0x0);
        local_1a8 = (page *)local_258.p_;
        if (local_258.p_ != (callable<void_(const_std::error_code_&)> *)0x0) {
          booster::atomic_counter::inc();
        }
        async_read_record(this,(handler *)&local_1a8);
        booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
                  ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)&local_1a8);
        booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
                  (&local_258);
      }
      else {
        (this->header_).type = '\x03';
        local_1a8 = (page *)CONCAT71(local_1a8._1_7_,8);
        std::vector<char,_std::allocator<char>_>::_M_fill_assign
                  (&this->body_,0,(value_type_conflict *)&local_1a8);
        puVar8 = (uint *)(this->body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start;
        *(undefined1 *)(puVar8 + 1) = 3;
        uVar3 = *puVar8;
        *puVar8 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
        self((fastcgi *)(local_1c8 + 0x10));
        mfunc_to_event_handler<cppcms::impl::cgi::fastcgi,std::shared_ptr<cppcms::impl::cgi::fastcgi>,booster::callback<void(std::error_code_const&)>const&,booster::callback<void(std::error_code_const&)>>
                  ((offset_in_fastcgi_to_subr)&local_250,
                   (shared_ptr<cppcms::impl::cgi::fastcgi> *)on_params_response_sent,
                   (callback<void_(const_std::error_code_&)> *)0x0);
        local_1a8 = (page *)local_250.p_;
        if ((page *)local_250.p_ != (page *)0x0) {
          booster::atomic_counter::inc();
        }
        async_send_respnse(this,(handler *)&local_1a8);
        booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
                  ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)&local_1a8);
        booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
                  (&local_250);
        local_1c8._8_8_ = local_1b0;
      }
      if ((element_type *)local_1c8._8_8_ == (element_type *)0x0) {
        return;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
      return;
    }
  }
  local_1a8 = (page *)CONCAT44(local_1a8._4_4_,1);
  local_1a0 = (error_category *)&cppcms_category;
  booster::callback<void_(const_std::error_code_&)>::operator()(h,(error_code *)&local_1a8);
  return;
}

Assistant:

void on_start_request(booster::system::error_code const &e,handler const &h)
		{
			if(e) {
				h(e);
				return;
			}
			if(header_.version!=fcgi_version_1)
			{
				h(booster::system::error_code(errc::protocol_violation,cppcms_category));
				return;
			}
			if(header_.type==fcgi_get_values) {
				header_.type = fcgi_get_values_result;
				std::vector<std::pair<std::string,std::string> > pairs;
				pairs.reserve(4);
				if(!parse_pairs(pairs)) {
					h(booster::system::error_code(errc::protocol_violation,cppcms_category));
					return;
				}
				body_.clear();
				std::locale l("C");
				std::ostringstream ss;
				ss.imbue(l);
				ss<<cuncurrency_hint_;
				for(unsigned i=0;i<pairs.size();i++) {
					std::string name=pairs[i].first;
					if(name=="FCGI_MAX_CONNS" || name=="FCGI_MAX_REQS")
						add_pair(name,ss.str());
					else if(name=="FCGI_MPXS_CONNS")
						add_pair(name,"0");
				}
				async_send_respnse(mfunc_to_event_handler(&fastcgi::on_params_response_sent,
								self(),
								h));
			}
			else if(header_.type!=fcgi_begin_request) {
				async_read_headers(h);
				return;
			}
			
			if(body_.size()!=sizeof(fcgi_request_body)) {
				h(booster::system::error_code(errc::protocol_violation,cppcms_category));
				return;
			}
			fcgi_request_body *body=reinterpret_cast<fcgi_request_body*>(&body_.front());
			body->to_host();
			keep_alive_=body->flags & fcgi_keep_conn;
			
			if(body->role!=fcgi_responder) {
				header_.type=fcgi_end_request;
				body_.assign(0,8);
				fcgi_end_request_body *body=reinterpret_cast<fcgi_end_request_body*>(&body_.front());
				body->protocol_status=fcgi_unknown_role;
				body->to_net();
				async_send_respnse(mfunc_to_event_handler(&fastcgi::on_params_response_sent,
								self(),
								h));
				return;
			}
			request_id_=header_.request_id;
			
			body_.clear();
			if(non_blocking_read_record()) {
				params_record_expected(booster::system::error_code(),h);
			}
			else {
				async_read_record(mfunc_to_event_handler(&fastcgi::params_record_expected,self(),h));
			}
		}